

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O0

result_type * __thiscall
jbcoin::sha512Half<unsigned_short,unsigned_int>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,uint *args_1)

{
  undefined1 local_f0 [8];
  sha512_half_hasher h;
  uint *args_local_1;
  unsigned_short *args_local;
  
  h.h_.ctx_._208_8_ = args;
  detail::basic_sha512_half_hasher<false>::basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_f0);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_short,unsigned_int>
            ((basic_sha512_half_hasher<false> *)local_f0,(unsigned_short *)this,
             (uint *)h.h_.ctx_._208_8_);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)local_f0);
  detail::basic_sha512_half_hasher<false>::~basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}